

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O0

void testTiledYa(string *tempDir)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  void *this;
  exception *e;
  Box2i dataWindow;
  int n;
  int maxThreads;
  string fileName;
  _func_void_Array2D<Imf_3_4::Rgba>_ptr_int_int *in_stack_000000c8;
  char *in_stack_000000d0;
  int in_stack_000000d8;
  int in_stack_000000dc;
  Box2i *in_stack_000000e0;
  Vec2<int> *in_stack_ffffffffffffff40;
  Vec2<int> *this_00;
  Box<Imath_3_2::Vec2<int>_> *this_01;
  char *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  Box<Imath_3_2::Vec2<int>_> local_60 [2];
  int local_40;
  int local_3c;
  string local_38 [56];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Testing tiled luminance input and output");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  bVar1 = IlmThread_3_4::supportsThreads();
  local_3c = 0;
  if ((bVar1 & 1) != 0) {
    local_3c = 3;
  }
  for (local_40 = 0; local_40 <= local_3c; local_40 = local_40 + 1) {
    bVar1 = IlmThread_3_4::supportsThreads();
    if ((bVar1 & 1) != 0) {
      Imf_3_4::setGlobalThreadCount(local_40);
      poVar3 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      iVar2 = Imf_3_4::globalThreadCount();
      this = (void *)std::ostream::operator<<(poVar3,iVar2);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    this_00 = &local_60[0].max;
    Imath_3_2::Vec2<int>::Vec2(this_00,-0x11,-0x1d);
    this_01 = local_60;
    Imath_3_2::Vec2<int>::Vec2(&this_01->min,0x15c,0x22c);
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(this_01,this_00,in_stack_ffffffffffffff40);
    std::__cxx11::string::c_str();
    anon_unknown.dwarf_2519ef::writeReadYa
              (in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d0,
               in_stack_000000c8);
    std::__cxx11::string::c_str();
    anon_unknown.dwarf_2519ef::writeReadYa
              (in_stack_000000e0,in_stack_000000dc,in_stack_000000d8,in_stack_000000d0,
               in_stack_000000c8);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
testTiledYa (const std::string& tempDir)
{
    try
    {
        cout << "Testing tiled luminance input and output" << endl;

        std::string fileName = tempDir + "imf_test_tiled_ya.exr";

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            Box2i dataWindow (V2i (-17, -29), V2i (348, 556));
            writeReadYa (dataWindow, 19, 27, fileName.c_str (), waves);
            writeReadYa (dataWindow, 19, 27, fileName.c_str (), wheel);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}